

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cache_test.cc
# Opt level: O2

void __thiscall
leveldb::CacheTest_UseExceedsCacheSize_Test::TestBody(CacheTest_UseExceedsCacheSize_Test *this)

{
  Cache *pCVar1;
  pointer *__ptr;
  char *message;
  int i;
  int iVar2;
  int iVar3;
  int i_1;
  ulong uVar4;
  bool bVar5;
  Message local_68;
  AssertionResult gtest_ar;
  AssertHelper local_50;
  vector<leveldb::Cache::Handle_*,_std::allocator<leveldb::Cache::Handle_*>_> h;
  
  h.super__Vector_base<leveldb::Cache::Handle_*,_std::allocator<leveldb::Cache::Handle_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  h.super__Vector_base<leveldb::Cache::Handle_*,_std::allocator<leveldb::Cache::Handle_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  h.super__Vector_base<leveldb::Cache::Handle_*,_std::allocator<leveldb::Cache::Handle_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  iVar2 = 0;
  iVar3 = 0x44c;
  while (bVar5 = iVar3 != 0, iVar3 = iVar3 + -1, bVar5) {
    gtest_ar._0_8_ =
         CacheTest::InsertAndReturnHandle(&this->super_CacheTest,iVar2 + 1000,iVar2 + 2000,1);
    std::vector<leveldb::Cache::Handle*,std::allocator<leveldb::Cache::Handle*>>::
    emplace_back<leveldb::Cache::Handle*>
              ((vector<leveldb::Cache::Handle*,std::allocator<leveldb::Cache::Handle*>> *)&h,
               (Handle **)&gtest_ar);
    iVar2 = iVar2 + 1;
  }
  uVar4 = 0;
  do {
    if ((ulong)((long)h.
                      super__Vector_base<leveldb::Cache::Handle_*,_std::allocator<leveldb::Cache::Handle_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)h.
                      super__Vector_base<leveldb::Cache::Handle_*,_std::allocator<leveldb::Cache::Handle_*>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 3) <= uVar4) {
      for (uVar4 = 0;
          uVar4 < (ulong)((long)h.
                                super__Vector_base<leveldb::Cache::Handle_*,_std::allocator<leveldb::Cache::Handle_*>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                          (long)h.
                                super__Vector_base<leveldb::Cache::Handle_*,_std::allocator<leveldb::Cache::Handle_*>_>
                                ._M_impl.super__Vector_impl_data._M_start >> 3); uVar4 = uVar4 + 1)
      {
        pCVar1 = (this->super_CacheTest).cache_;
        (*pCVar1->_vptr_Cache[4])
                  (pCVar1,h.
                          super__Vector_base<leveldb::Cache::Handle_*,_std::allocator<leveldb::Cache::Handle_*>_>
                          ._M_impl.super__Vector_impl_data._M_start[uVar4]);
      }
LAB_0010a0cf:
      std::_Vector_base<leveldb::Cache::Handle_*,_std::allocator<leveldb::Cache::Handle_*>_>::
      ~_Vector_base(&h.
                     super__Vector_base<leveldb::Cache::Handle_*,_std::allocator<leveldb::Cache::Handle_*>_>
                   );
      return;
    }
    local_68.ss_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._0_4_ = (int)uVar4 + 2000;
    local_50.data_._0_4_ = CacheTest::Lookup(&this->super_CacheTest,(int)uVar4 + 1000);
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)&gtest_ar,"2000 + i","Lookup(1000 + i)",(int *)&local_68,(int *)&local_50
              );
    if (gtest_ar.success_ == false) {
      testing::Message::Message(&local_68);
      if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )gtest_ar.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl ==
          (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )0x0) {
        message = "";
      }
      else {
        message = *(char **)gtest_ar.message_._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_50,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/util/cache_test.cc"
                 ,0xa2,message);
      testing::internal::AssertHelper::operator=(&local_50,&local_68);
      testing::internal::AssertHelper::~AssertHelper(&local_50);
      if ((long *)CONCAT44(local_68.ss_._M_t.
                           super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                           ._M_head_impl._4_4_,
                           (int)local_68.ss_._M_t.
                                super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                .
                                super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                ._M_head_impl) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT44(local_68.ss_._M_t.
                                       super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       .
                                       super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                       ._M_head_impl._4_4_,
                                       (int)local_68.ss_._M_t.
                                            super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            ._M_t.
                                            super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            .
                                            super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                            ._M_head_impl) + 8))();
      }
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(&gtest_ar.message_);
      goto LAB_0010a0cf;
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar.message_);
    uVar4 = uVar4 + 1;
  } while( true );
}

Assistant:

TEST_F(CacheTest, UseExceedsCacheSize) {
  // Overfill the cache, keeping handles on all inserted entries.
  std::vector<Cache::Handle*> h;
  for (int i = 0; i < kCacheSize + 100; i++) {
    h.push_back(InsertAndReturnHandle(1000 + i, 2000 + i));
  }

  // Check that all the entries can be found in the cache.
  for (int i = 0; i < h.size(); i++) {
    ASSERT_EQ(2000 + i, Lookup(1000 + i));
  }

  for (int i = 0; i < h.size(); i++) {
    cache_->Release(h[i]);
  }
}